

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O1

void __thiscall
IlmThread_2_5::anon_unknown_5::DefaultThreadPoolProvider::addTask
          (DefaultThreadPoolProvider *this,Task *task)

{
  Mutex *__mutex;
  pointer *pppTVar1;
  iterator __position;
  Data *pDVar2;
  int iVar3;
  Task *local_18;
  
  local_18 = task;
  if (((this->_data).hasThreads._M_base._M_i & 1U) == 0) {
    (*task->_vptr_Task[2])(task);
    pDVar2 = local_18->_group->_data;
    LOCK();
    (pDVar2->numPending).super___atomic_base<int>._M_i =
         (pDVar2->numPending).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->numPending).super___atomic_base<int>._M_i == 0) {
      Semaphore::post(&pDVar2->isEmpty);
    }
    if (local_18 != (Task *)0x0) {
      (*local_18->_vptr_Task[1])();
      return;
    }
  }
  else {
    __mutex = &(this->_data).taskMutex;
    iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar3 != 0) {
      std::__throw_system_error(iVar3);
    }
    __position._M_current =
         (this->_data).tasks.
         super__Vector_base<IlmThread_2_5::Task_*,_std::allocator<IlmThread_2_5::Task_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->_data).tasks.
        super__Vector_base<IlmThread_2_5::Task_*,_std::allocator<IlmThread_2_5::Task_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<IlmThread_2_5::Task*,std::allocator<IlmThread_2_5::Task*>>::
      _M_realloc_insert<IlmThread_2_5::Task*const&>
                ((vector<IlmThread_2_5::Task*,std::allocator<IlmThread_2_5::Task*>> *)
                 &(this->_data).tasks,__position,&local_18);
    }
    else {
      *__position._M_current = local_18;
      pppTVar1 = &(this->_data).tasks.
                  super__Vector_base<IlmThread_2_5::Task_*,_std::allocator<IlmThread_2_5::Task_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppTVar1 = *pppTVar1 + 1;
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    Semaphore::post(&(this->_data).taskSemaphore);
  }
  return;
}

Assistant:

void
DefaultThreadPoolProvider::addTask (Task *task)
{
    //
    // Lock the threads, needed to access numThreads
    //
#ifdef ILMBASE_FORCE_CXX03
    bool doPush;
    {
        Lock lock (_data.threadMutex);
        doPush = !_data.threads.empty();
    }
#else
    bool doPush = _data.hasThreads.load( std::memory_order_relaxed );
#endif

    if ( doPush )
    {
        //
        // Get exclusive access to the tasks queue
        //

        {
            Lock taskLock (_data.taskMutex);

            //
            // Push the new task into the FIFO
            //
            _data.tasks.push_back (task);
        }
        
        //
        // Signal that we have a new task to process
        //
        _data.taskSemaphore.post ();
    }
    else
    {
        // this path shouldn't normally happen since we have the
        // NullThreadPoolProvider, but just in case...
        task->execute ();
        task->group()->_data->removeTask ();
        delete task;
    }
}